

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O2

Object<cmCMakePresetsGraph::ConfigurePreset> * __thiscall
cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
Object<cmCMakePresetsGraph::ConfigurePreset>::
Bind<std::function<cmCMakePresetsGraph::ReadFileResult(cmCMakePresetsGraph::ConfigurePreset&,Json::Value_const*)>>
          (Object<cmCMakePresetsGraph::ConfigurePreset> *this,string_view *name,
          function<cmCMakePresetsGraph::ReadFileResult_(cmCMakePresetsGraph::ConfigurePreset_&,_const_Json::Value_*)>
          *func,bool required)

{
  Object<cmCMakePresetsGraph::ConfigurePreset> *pOVar1;
  function<cmCMakePresetsGraph::ReadFileResult_(cmCMakePresetsGraph::ConfigurePreset_&,_const_Json::Value_*)>
  local_40;
  
  std::
  function<cmCMakePresetsGraph::ReadFileResult_(cmCMakePresetsGraph::ConfigurePreset_&,_const_Json::Value_*)>
  ::function(&local_40,func);
  pOVar1 = BindPrivate(this,name,&local_40,required);
  std::_Function_base::~_Function_base(&local_40.super__Function_base);
  return pOVar1;
}

Assistant:

Object& Bind(const cm::string_view& name, F func, bool required = true)
    {
      return this->BindPrivate(name, MemberFunction(func), required);
    }